

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O0

size_t __thiscall spdlog::details::file_helper::size(file_helper *this)

{
  spdlog_ex *this_00;
  size_t sVar1;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  file_helper *local_10;
  file_helper *this_local;
  
  local_10 = this;
  if (this->_fd == (FILE *)0x0) {
    this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
    os::filename_to_str(&local_50,&this->_filename);
    std::operator+(&local_30,"Cannot use size() on closed file ",&local_50);
    spdlog_ex::spdlog_ex(this_00,&local_30);
    __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  sVar1 = os::filesize(this->_fd);
  return sVar1;
}

Assistant:

size_t size() const
    {
        if (_fd == nullptr)
        {
            throw spdlog_ex("Cannot use size() on closed file " + os::filename_to_str(_filename));
        }
        return os::filesize(_fd);
    }